

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# material.cpp
# Opt level: O3

void __thiscall Material::Material(Material *this,Shader *shader)

{
  _Rb_tree_header *p_Var1;
  
  this->_vptr_Material = (_func_int **)&PTR__Material_00254730;
  p_Var1 = &(this->vec3Uniforms)._M_t._M_impl.super__Rb_tree_header;
  (this->vec3Uniforms)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->vec3Uniforms)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->vec3Uniforms)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->vec3Uniforms)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->vec3Uniforms)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->vec4Uniforms)._M_t._M_impl.super__Rb_tree_header;
  (this->vec4Uniforms)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->vec4Uniforms)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->vec4Uniforms)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->vec4Uniforms)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->vec4Uniforms)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->mat4Uniforms)._M_t._M_impl.super__Rb_tree_header;
  (this->mat4Uniforms)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mat4Uniforms)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->mat4Uniforms)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->mat4Uniforms)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->mat4Uniforms)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->floatUniforms)._M_t._M_impl.super__Rb_tree_header;
  (this->floatUniforms)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->floatUniforms)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->floatUniforms)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->floatUniforms)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->floatUniforms)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->intUniforms)._M_t._M_impl.super__Rb_tree_header;
  (this->intUniforms)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->intUniforms)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->intUniforms)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->intUniforms)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->intUniforms)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->textureUniforms)._M_t._M_impl.super__Rb_tree_header;
  (this->textureUniforms)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->textureUniforms)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->textureUniforms)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->textureUniforms)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->textureUniforms)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->shader = shader;
  return;
}

Assistant:

Material::Material(Shader* shader)
{
	this->shader = shader;
}